

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void ClearShrink<std::deque<CompressedHeader,std::allocator<CompressedHeader>>>
               (deque<CompressedHeader,_std::allocator<CompressedHeader>_> *v)

{
  long in_FS_OFFSET;
  _Deque_impl_data local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_map = (_Map_pointer)0x0;
  local_68._M_map_size = 0;
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::_Deque_base
            ((_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> *)&local_68);
  std::swap<std::_Deque_base<CompressedHeader,std::allocator<CompressedHeader>>::_Deque_impl_data>
            (&local_68,(_Deque_impl_data *)v);
  std::_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_>::~_Deque_base
            ((_Deque_base<CompressedHeader,_std::allocator<CompressedHeader>_> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ClearShrink(V& v) noexcept
{
    // There are various ways to clear a vector and release its memory:
    //
    // 1. V{}.swap(v)
    // 2. v = V{}
    // 3. v = {}; v.shrink_to_fit();
    // 4. v.clear(); v.shrink_to_fit();
    //
    // (2) does not appear to release memory in glibc debug mode, even if v.shrink_to_fit()
    // follows. (3) and (4) rely on std::vector::shrink_to_fit, which is only a non-binding
    // request. Therefore, we use method (1).

    V{}.swap(v);
}